

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O3

pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool> *
__thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert
          (pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
           *__return_storage_ptr__,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val)

{
  pair<int,_int> *ppVar1;
  pointer pvVar2;
  ValueIterator VVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  size_t bucketIdx;
  ulong local_28;
  
  *(undefined8 *)((long)&(__return_storage_ptr__->first).mCurBucketItr._M_current + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->first).mEndBucketItr._M_current + 1) = 0;
  (__return_storage_ptr__->first).mCurValueItr._M_current = (pair<int,_int> *)0x0;
  (__return_storage_ptr__->first).mCurBucketItr._M_current =
       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0;
  pvVar5 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = (ulong)(long)val->first %
             (ulong)(((long)pvVar6 - (long)pvVar5 >> 3) * -0x5555555555555555);
  ppVar1 = *(pointer *)
            ((long)&pvVar5[local_28].
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl + 8);
  for (VVar3._M_current =
            *(pair<int,_int> **)
             &pvVar5[local_28].
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
      ; VVar3._M_current != ppVar1; VVar3._M_current = VVar3._M_current + 1) {
    if ((VVar3._M_current)->first == val->first) {
      __return_storage_ptr__->second = false;
      if (VVar3._M_current == ppVar1) goto LAB_00101991;
      goto LAB_001019b1;
    }
  }
  __return_storage_ptr__->second = false;
LAB_00101991:
  VVar3 = insert_to_bucket(this,val,&local_28);
  __return_storage_ptr__->second = true;
  pvVar5 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001019b1:
  pvVar5 = pvVar5 + local_28;
  if ((pvVar5 != pvVar6) &&
     (pvVar4 = pvVar5,
     (pvVar5->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
     _M_impl.super__Vector_impl_data._M_finish == VVar3._M_current)) {
    do {
      pvVar5 = pvVar4 + 1;
      if (pvVar5 == pvVar6) break;
      VVar3._M_current =
           (pvVar5->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
      pvVar2 = pvVar4 + 1;
      pvVar4 = pvVar5;
    } while (VVar3._M_current ==
             (pvVar2->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->first).mCurValueItr._M_current = VVar3._M_current;
  (__return_storage_ptr__->first).mCurBucketItr._M_current = pvVar5;
  (__return_storage_ptr__->first).mEndBucketItr._M_current = pvVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator,bool> insert(const ValueT& val) {
      std::pair<iterator,bool> result;
      size_t bucketIdx = hash_to_bucket(val.first);
      ValueIterator it = find_in_bucket(mBuckets[bucketIdx], val.first);
      result.second = false;
      if (it == mBuckets[bucketIdx].end()) {
        it = insert_to_bucket(val, bucketIdx );
        result.second = true;
      }
      result.first = iterator(it,
                              mBuckets.begin()+bucketIdx,
                              mBuckets.end());
      return result;
    }